

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lights.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createLightSource_distant(SemanticParser *this,SP *in)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  bool bVar8;
  _Rb_tree_node_base *p_Var9;
  runtime_error *this_00;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vec3f *result;
  ParamSet *this_01;
  SP SVar10;
  SP light;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  
  std::make_shared<pbrt::DistantLightSource>();
  lVar1 = *in_RDX;
  uVar2 = *(undefined8 *)(lVar1 + 0x58);
  uVar3 = *(undefined8 *)(lVar1 + 0x60);
  uVar4 = *(undefined8 *)(lVar1 + 0x68);
  uVar5 = *(undefined8 *)(lVar1 + 0x70);
  uVar6 = *(undefined8 *)(lVar1 + 0x80);
  *(undefined8 *)
   &((light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    transform).l.vz.z = *(undefined8 *)(lVar1 + 0x78);
  ((light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  transform).p.y = (float)(int)uVar6;
  ((light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  transform).p.z = (float)(int)((ulong)uVar6 >> 0x20);
  ((light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  transform).l.vy.y = (float)(int)uVar4;
  ((light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  transform).l.vy.z = (float)(int)((ulong)uVar4 >> 0x20);
  ((light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  transform).l.vz.x = (float)(int)uVar5;
  ((light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  transform).l.vz.y = (float)(int)((ulong)uVar5 >> 0x20);
  ((light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  transform).l.vx.x = (float)(int)uVar2;
  ((light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  transform).l.vx.y = (float)(int)((ulong)uVar2 >> 0x20);
  *(undefined8 *)
   &((light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    transform).l.vx.z = uVar3;
  lVar1 = *in_RDX;
  p_Var9 = *(_Rb_tree_node_base **)(lVar1 + 0x20);
  do {
    _Var7._M_pi = light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (p_Var9 == (_Rb_tree_node_base *)(lVar1 + 0x10)) {
      light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var7._M_pi;
      light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      SVar10.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar10.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (SP)SVar10.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(&it,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
                *)(p_Var9 + 1));
    std::__cxx11::string::string((string *)&name,(string *)&it);
    bVar8 = std::operator==(&name,"from");
    if (bVar8) {
      this_01 = (ParamSet *)(*in_RDX + 8);
      result = &(light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->from;
    }
    else {
      bVar8 = std::operator==(&name,"to");
      if (bVar8) {
        this_01 = (ParamSet *)(*in_RDX + 8);
        result = &(light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->to;
      }
      else {
        bVar8 = std::operator==(&name,"L");
        if (bVar8) {
          this_01 = (ParamSet *)(*in_RDX + 8);
          result = &(light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->L;
        }
        else {
          bVar8 = std::operator==(&name,"scale");
          if (!bVar8) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_c0,"unknown \'distant\' light source param \'",&name);
            std::operator+(&local_a0,&local_c0,"\'");
            std::runtime_error::runtime_error(this_00,(string *)&local_a0);
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          this_01 = (ParamSet *)(*in_RDX + 8);
          result = &(light.super___shared_ptr<pbrt::DistantLightSource,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->scale;
        }
      }
    }
    syntactic::ParamSet::getParam3f(this_01,&result->x,&name);
    std::__cxx11::string::~string((string *)&name);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(&it);
    p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
  } while( true );
}

Assistant:

LightSource::SP SemanticParser::createLightSource_distant
  (pbrt::syntactic::LightSource::SP in)
  {
    DistantLightSource::SP light = std::make_shared<DistantLightSource>();
    light->transform = in->transform.atStart;
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "from") {
        in->getParam3f(&light->from.x,name);
        continue;
      }
      if (name == "to") {
        in->getParam3f(&light->to.x,name);
        continue;
      }
      if (name == "L") {
        in->getParam3f(&light->L.x,name);
        continue;
      }
      if (name == "scale") {
        in->getParam3f(&light->scale.x,name);
        continue;
      }
      throw std::runtime_error("unknown 'distant' light source param '"+name+"'");
    }
    return light;
  }